

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt,int qualified)

{
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  uint local_c0;
  uint local_b8;
  xmlChar *tmp;
  xmlChar *pxStack_a0;
  int max;
  xmlChar *buffer;
  int local_90;
  int c;
  int l;
  int len;
  xmlChar buf [105];
  int qualified_local;
  xmlXPathParserContextPtr ctxt_local;
  
  c = 0;
  buf._100_4_ = qualified;
  unique0x10000522 = ctxt;
  buffer._4_4_ = xmlXPathCurrentChar(ctxt,&local_90);
  if (buffer._4_4_ == 0x20) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x3e) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x2f) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x5b) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x5d) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x40) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x2a) {
    return (xmlChar *)0x0;
  }
  if ((int)buffer._4_4_ < 0x100) {
    if (((((0x40 < (int)buffer._4_4_) && ((int)buffer._4_4_ < 0x5b)) ||
         ((0x60 < (int)buffer._4_4_ && ((int)buffer._4_4_ < 0x7b)))) ||
        ((0xbf < (int)buffer._4_4_ && ((int)buffer._4_4_ < 0xd7)))) ||
       (((0xd7 < (int)buffer._4_4_ && ((int)buffer._4_4_ < 0xf7)) || (0xf7 < (int)buffer._4_4_))))
    goto LAB_00254a1e;
  }
  else {
    iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsBaseCharGroup);
    if (iVar1 != 0) goto LAB_00254a1e;
  }
  if ((((int)buffer._4_4_ < 0x100) ||
      (((((int)buffer._4_4_ < 0x4e00 || (0x9fa5 < (int)buffer._4_4_)) && (buffer._4_4_ != 0x3007))
       && (((int)buffer._4_4_ < 0x3021 || (0x3029 < (int)buffer._4_4_)))))) &&
     (buffer._4_4_ != 0x5f)) {
    if (buf._100_4_ == 0) {
      return (xmlChar *)0x0;
    }
    if (buffer._4_4_ != 0x3a) {
      return (xmlChar *)0x0;
    }
  }
LAB_00254a1e:
  do {
    bVar3 = false;
    if (((buffer._4_4_ != 0x20) && (bVar3 = false, buffer._4_4_ != 0x3e)) &&
       (bVar3 = false, buffer._4_4_ != 0x2f)) {
      if ((int)buffer._4_4_ < 0x100) {
        if ((((((int)buffer._4_4_ < 0x41) || (bVar3 = true, 0x5a < (int)buffer._4_4_)) &&
             ((((int)buffer._4_4_ < 0x61 || (bVar3 = true, 0x7a < (int)buffer._4_4_)) &&
              (((int)buffer._4_4_ < 0xc0 || (bVar3 = true, 0xd6 < (int)buffer._4_4_)))))) &&
            (((int)buffer._4_4_ < 0xd8 || (bVar3 = true, 0xf6 < (int)buffer._4_4_)))) &&
           (bVar3 = true, (int)buffer._4_4_ < 0xf8)) {
LAB_00254b3b:
          if (((int)buffer._4_4_ < 0x100) ||
             (((((int)buffer._4_4_ < 0x4e00 || (bVar3 = true, 0x9fa5 < (int)buffer._4_4_)) &&
               (bVar3 = true, buffer._4_4_ != 0x3007)) &&
              (((int)buffer._4_4_ < 0x3021 || (bVar3 = true, 0x3029 < (int)buffer._4_4_)))))) {
            if ((int)buffer._4_4_ < 0x100) {
              if (((int)buffer._4_4_ < 0x30) || (bVar3 = true, 0x39 < (int)buffer._4_4_)) {
LAB_00254c13:
                bVar3 = true;
                if (((buffer._4_4_ != 0x2e) &&
                    ((bVar3 = true, buffer._4_4_ != 0x2d && (bVar3 = true, buffer._4_4_ != 0x5f))))
                   && ((buf._100_4_ == 0 || (bVar3 = true, buffer._4_4_ != 0x3a)))) {
                  if (0xff < (int)buffer._4_4_) {
                    iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsCombiningGroup);
                    bVar3 = true;
                    if (iVar1 != 0) goto LAB_00254d07;
                  }
                  if ((int)buffer._4_4_ < 0x100) {
                    local_b8 = (uint)(buffer._4_4_ == 0xb7);
                  }
                  else {
                    local_b8 = xmlCharInRange(buffer._4_4_,&xmlIsExtenderGroup);
                  }
                  bVar3 = local_b8 != 0;
                }
              }
            }
            else {
              iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsDigitGroup);
              bVar3 = true;
              if (iVar1 == 0) goto LAB_00254c13;
            }
          }
        }
      }
      else {
        iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsBaseCharGroup);
        bVar3 = true;
        if (iVar1 == 0) goto LAB_00254b3b;
      }
    }
LAB_00254d07:
    if (!bVar3) {
      if (c == 0) {
        return (xmlChar *)0x0;
      }
      pxVar2 = xmlStrndup((xmlChar *)&l,c);
      return pxVar2;
    }
    if (local_90 == 1) {
      *(char *)((long)&l + (long)c) = (char)buffer._4_4_;
      c = c + 1;
    }
    else {
      iVar1 = xmlCopyChar(local_90,(xmlChar *)((long)&l + (long)c),buffer._4_4_);
      c = iVar1 + c;
    }
    stack0xffffffffffffffe8->cur = stack0xffffffffffffffe8->cur + local_90;
    buffer._4_4_ = xmlXPathCurrentChar(stack0xffffffffffffffe8,&local_90);
  } while (c < 100);
  tmp._4_4_ = c << 1;
  if (c < 0xc351) {
    pxStack_a0 = (xmlChar *)(*xmlMallocAtomic)((long)tmp._4_4_);
    if (pxStack_a0 != (xmlChar *)0x0) {
      memcpy(pxStack_a0,&l,(long)c);
      do {
        if ((int)buffer._4_4_ < 0x100) {
          if ((((((int)buffer._4_4_ < 0x41) || (bVar3 = true, 0x5a < (int)buffer._4_4_)) &&
               (((int)buffer._4_4_ < 0x61 || (bVar3 = true, 0x7a < (int)buffer._4_4_)))) &&
              ((((int)buffer._4_4_ < 0xc0 || (bVar3 = true, 0xd6 < (int)buffer._4_4_)) &&
               (((int)buffer._4_4_ < 0xd8 || (bVar3 = true, 0xf6 < (int)buffer._4_4_)))))) &&
             (bVar3 = true, (int)buffer._4_4_ < 0xf8)) {
LAB_00254f0d:
            if (((int)buffer._4_4_ < 0x100) ||
               (((((int)buffer._4_4_ < 0x4e00 || (bVar3 = true, 0x9fa5 < (int)buffer._4_4_)) &&
                 (bVar3 = true, buffer._4_4_ != 0x3007)) &&
                (((int)buffer._4_4_ < 0x3021 || (bVar3 = true, 0x3029 < (int)buffer._4_4_)))))) {
              if ((int)buffer._4_4_ < 0x100) {
                if (((int)buffer._4_4_ < 0x30) || (bVar3 = true, 0x39 < (int)buffer._4_4_)) {
LAB_00254fe5:
                  bVar3 = true;
                  if (((buffer._4_4_ != 0x2e) &&
                      ((bVar3 = true, buffer._4_4_ != 0x2d && (bVar3 = true, buffer._4_4_ != 0x5f)))
                      ) && ((buf._100_4_ == 0 || (bVar3 = true, buffer._4_4_ != 0x3a)))) {
                    if (0xff < (int)buffer._4_4_) {
                      iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsCombiningGroup);
                      bVar3 = true;
                      if (iVar1 != 0) goto LAB_002550cd;
                    }
                    if ((int)buffer._4_4_ < 0x100) {
                      local_c0 = (uint)(buffer._4_4_ == 0xb7);
                    }
                    else {
                      local_c0 = xmlCharInRange(buffer._4_4_,&xmlIsExtenderGroup);
                    }
                    bVar3 = local_c0 != 0;
                  }
                }
              }
              else {
                iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsDigitGroup);
                bVar3 = true;
                if (iVar1 == 0) goto LAB_00254fe5;
              }
            }
          }
        }
        else {
          iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsBaseCharGroup);
          bVar3 = true;
          if (iVar1 == 0) goto LAB_00254f0d;
        }
LAB_002550cd:
        if (!bVar3) {
          pxStack_a0[c] = '\0';
          return pxStack_a0;
        }
        pxVar2 = pxStack_a0;
        if (tmp._4_4_ < c + 10) {
          if (50000 < tmp._4_4_) {
            (*xmlFree)(pxStack_a0);
            xmlXPathErr(stack0xffffffffffffffe8,7);
            return (xmlChar *)0x0;
          }
          tmp._4_4_ = tmp._4_4_ << 1;
          pxVar2 = (xmlChar *)(*xmlRealloc)(pxStack_a0,(long)tmp._4_4_);
          if (pxVar2 == (xmlChar *)0x0) {
            (*xmlFree)(pxStack_a0);
            xmlXPathErr(stack0xffffffffffffffe8,0xf);
            return (xmlChar *)0x0;
          }
        }
        pxStack_a0 = pxVar2;
        if (local_90 == 1) {
          pxStack_a0[c] = (xmlChar)buffer._4_4_;
          c = c + 1;
        }
        else {
          iVar1 = xmlCopyChar(local_90,pxStack_a0 + c,buffer._4_4_);
          c = iVar1 + c;
        }
        stack0xffffffffffffffe8->cur = stack0xffffffffffffffe8->cur + local_90;
        buffer._4_4_ = xmlXPathCurrentChar(stack0xffffffffffffffe8,&local_90);
      } while( true );
    }
    xmlXPathErr(stack0xffffffffffffffe8,0xf);
  }
  else {
    xmlXPathErr(stack0xffffffffffffffe8,7);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt, int qualified) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;

    /*
     * Handler for more complex cases
     */
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
        (c == '[') || (c == ']') || (c == '@') || /* accelerators */
        (c == '*') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         ((!qualified) || (c != ':')))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || ((qualified) && (c == ':')) ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	COPY_BUF(l,buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

            if (len > XML_MAX_NAME_LENGTH) {
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
		XP_ERRORNULL(XPATH_MEMORY_ERROR);
	    }
	    memcpy(buffer, buf, len);
	    while ((IS_LETTER(c)) || (IS_DIGIT(c)) || /* test bigname.xml */
		   (c == '.') || (c == '-') ||
		   (c == '_') || ((qualified) && (c == ':')) ||
		   (IS_COMBINING(c)) ||
		   (IS_EXTENDER(c))) {
		if (len + 10 > max) {
                    xmlChar *tmp;
                    if (max > XML_MAX_NAME_LENGTH) {
                        xmlFree(buffer);
                        XP_ERRORNULL(XPATH_EXPR_ERROR);
                    }
		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
                        xmlFree(buffer);
			XP_ERRORNULL(XPATH_MEMORY_ERROR);
		    }
                    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
	return(NULL);
    return(xmlStrndup(buf, len));
}